

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O0

bool __thiscall s2coding::EncodedStringVector::Init(EncodedStringVector *this,Decoder *decoder)

{
  bool bVar1;
  uchar *puVar2;
  size_t sVar3;
  unsigned_long_long n;
  uint64 length;
  Decoder *decoder_local;
  EncodedStringVector *this_local;
  
  bVar1 = EncodedUintVector<unsigned_long_long>::Init(&this->offsets_,decoder);
  if (bVar1) {
    puVar2 = Decoder::ptr(decoder);
    this->data_ = (char *)puVar2;
    sVar3 = EncodedUintVector<unsigned_long_long>::size(&this->offsets_);
    if (sVar3 != 0) {
      sVar3 = EncodedUintVector<unsigned_long_long>::size(&this->offsets_);
      n = EncodedUintVector<unsigned_long_long>::operator[](&this->offsets_,(int)sVar3 + -1);
      sVar3 = Decoder::avail(decoder);
      if (sVar3 < n) {
        return false;
      }
      Decoder::skip(decoder,n);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EncodedStringVector::Init(Decoder* decoder) {
  if (!offsets_.Init(decoder)) return false;
  data_ = reinterpret_cast<const char*>(decoder->ptr());
  if (offsets_.size() > 0) {
    uint64 length = offsets_[offsets_.size() - 1];
    if (decoder->avail() < length) return false;
    decoder->skip(length);
  }
  return true;
}